

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SettingsUI.cpp
# Opt level: O2

void __thiscall LTSettingsUI::LTSettingsUI(LTSettingsUI *this)

{
  LTSettingsUI *this_00;
  int __val;
  long lVar1;
  array<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_14UL>
  *vs;
  WndRect _initPos;
  allocator<char> local_f9;
  LTSettingsUI *local_f8;
  string *local_f0;
  string *local_e8;
  string *local_e0;
  string *local_d8;
  string *local_d0;
  string *local_c8;
  string *local_c0;
  string *local_b8;
  string *local_b0;
  string *local_a8;
  string *local_a0;
  string *local_98;
  string *local_90;
  string *local_88;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_14UL>
  *local_80;
  string *local_78;
  string local_70;
  string local_50;
  
  _initPos.br = dataRefs.SUIrect.br;
  _initPos.tl = dataRefs.SUIrect.tl;
  LTImgWindow::LTImgWindow
            (&this->super_LTImgWindow,WND_MODE_FLOAT_CNT_VR,
             WND_STYLE_HUD - (dataRefs.SUItransp == 0),_initPos);
  (this->super_LTImgWindow).super_ImgWindow._vptr_ImgWindow =
       (_func_int **)&PTR__LTSettingsUI_002bcb58;
  this->sFilter[0] = '\0';
  this->sFilter[1] = '\0';
  this->sFilter[2] = '\0';
  this->sFilter[3] = '\0';
  this->sFilter[4] = '\0';
  this->sFilter[5] = '\0';
  this->sFilter[6] = '\0';
  this->sFilter[7] = '\0';
  this->sFilter[8] = '\0';
  this->sFilter[9] = '\0';
  this->sFilter[10] = '\0';
  this->sFilter[0xb] = '\0';
  this->sFilter[0xc] = '\0';
  this->sFilter[0xd] = '\0';
  this->sFilter[0xe] = '\0';
  this->sFilter[0xf] = '\0';
  this->sFilter[0x10] = '\0';
  this->sFilter[0x11] = '\0';
  this->sFilter[0x12] = '\0';
  this->sFilter[0x13] = '\0';
  this->sFilter[0x14] = '\0';
  this->sFilter[0x15] = '\0';
  this->sFilter[0x16] = '\0';
  this->sFilter[0x17] = '\0';
  this->sFilter[0x18] = '\0';
  this->sFilter[0x19] = '\0';
  this->sFilter[0x1a] = '\0';
  this->sFilter[0x1b] = '\0';
  this->sFilter[0x1c] = '\0';
  this->sFilter[0x1d] = '\0';
  this->sFilter[0x1e] = '\0';
  this->sFilter[0x1f] = '\0';
  this->sFilter[0x20] = '\0';
  this->sFilter[0x21] = '\0';
  this->sFilter[0x22] = '\0';
  this->sFilter[0x23] = '\0';
  this->sFilter[0x24] = '\0';
  this->sFilter[0x25] = '\0';
  this->sFilter[0x26] = '\0';
  this->sFilter[0x27] = '\0';
  this->sFilter[0x28] = '\0';
  this->sFilter[0x29] = '\0';
  this->sFilter[0x2a] = '\0';
  this->sFilter[0x2b] = '\0';
  this->sFilter[0x2c] = '\0';
  this->sFilter[0x2d] = '\0';
  this->sFilter[0x2e] = '\0';
  this->sFilter[0x2f] = '\0';
  this->sFilter[0x30] = '\0';
  this->sFilter[0x31] = '\0';
  (this->sOpenSkyUser)._M_dataplus._M_p = (pointer)&(this->sOpenSkyUser).field_2;
  (this->sOpenSkyUser)._M_string_length = 0;
  (this->sOpenSkyUser).field_2._M_local_buf[0] = '\0';
  (this->sOpenSkyPwd)._M_dataplus._M_p = (pointer)&(this->sOpenSkyPwd).field_2;
  (this->sOpenSkyPwd)._M_string_length = 0;
  local_c0 = &this->sOpenSkyUser;
  local_c8 = &this->sOpenSkyPwd;
  (this->sOpenSkyPwd).field_2._M_local_buf[0] = '\0';
  this->bOpenSkyPwdClearText = false;
  this->eADSBExKeyTest = ADSBX_KEY_NO_ACTION;
  std::__cxx11::string::string((string *)&this->sADSBExKeyEntry,(string *)&dataRefs.sADSBExAPIKey);
  this->bADSBExKeyClearText = (this->sADSBExKeyEntry)._M_string_length == 0;
  local_80 = &this->aFlarmAcTys;
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_14UL>
  ::array(local_80);
  (this->sRTLicenseEntry)._M_dataplus._M_p = (pointer)&(this->sRTLicenseEntry).field_2;
  (this->sRTLicenseEntry)._M_string_length = 0;
  (this->sRTLicenseEntry).field_2._M_local_buf[0] = '\0';
  this->bRTLicClearText = false;
  (this->tmRTManTOfs).tm_sec = 0;
  (this->tmRTManTOfs).tm_min = 0;
  (this->tmRTManTOfs).tm_hour = 0;
  (this->tmRTManTOfs).tm_mday = 0;
  (this->tmRTManTOfs).tm_mon = 0;
  (this->tmRTManTOfs).tm_year = 0;
  (this->tmRTManTOfs).tm_wday = 0;
  (this->tmRTManTOfs).tm_yday = 0;
  (this->tmRTManTOfs).tm_isdst = 0;
  (this->tmRTManTOfs).tm_gmtoff = 0;
  (this->tmRTManTOfs).tm_zone = (char *)0x0;
  this->bRTModifyTOfs = false;
  this->bRTZuluTime = false;
  (this->sRTPort)._M_dataplus._M_p = (pointer)&(this->sRTPort).field_2;
  (this->sRTPort)._M_string_length = 0;
  (this->sRTPort).field_2._M_local_buf[0] = '\0';
  (this->sFSCUser)._M_dataplus._M_p = (pointer)&(this->sFSCUser).field_2;
  (this->sFSCUser)._M_string_length = 0;
  local_d0 = (string *)&this->sRTLicenseEntry;
  (this->sFSCUser).field_2._M_local_buf[0] = '\0';
  (this->sFSCPwd)._M_dataplus._M_p = (pointer)&(this->sFSCPwd).field_2;
  (this->sFSCPwd)._M_string_length = 0;
  local_d8 = (string *)&this->sRTPort;
  (this->sFSCPwd).field_2._M_local_buf[0] = '\0';
  this->bFSCPwdClearText = false;
  (this->sSIDisplayName)._M_dataplus._M_p = (pointer)&(this->sSIDisplayName).field_2;
  (this->sSIDisplayName)._M_string_length = 0;
  local_e0 = &this->sFSCUser;
  (this->sSIDisplayName).field_2._M_local_buf[0] = '\0';
  (this->txtManualMETAR)._M_dataplus._M_p = (pointer)&(this->txtManualMETAR).field_2;
  (this->txtManualMETAR)._M_string_length = 0;
  (this->txtManualMETAR).field_2._M_local_buf[0] = '\0';
  this->cslActiveLn = -1;
  (this->cslEntry)._M_dataplus._M_p = (pointer)&(this->cslEntry).field_2;
  (this->cslEntry)._M_string_length = 0;
  (this->cslEntry).field_2._M_local_buf[0] = '\0';
  this->bCslEntryExists = false;
  this->bSubDirsOpen = false;
  local_e8 = &this->sFSCPwd;
  local_f0 = (string *)&this->sSIDisplayName;
  (this->cslNew)._M_dataplus._M_p = (pointer)&(this->cslNew).field_2;
  (this->cslNew)._M_string_length = 0;
  (this->cslNew).field_2._M_local_buf[0] = '\0';
  this->bCslNewExists = false;
  this->bNewSubDirsOpen = false;
  local_f8 = this;
  local_78 = &this->sADSBExKeyEntry;
  std::__cxx11::string::string((string *)&this->acTypeEntry,(string *)&dataRefs.sDefaultAcIcaoType);
  this->acTypeOK = 0;
  local_88 = &this->acTypeEntry;
  std::__cxx11::string::string
            ((string *)&this->gndVehicleEntry,(string *)&dataRefs.sDefaultCarIcaoType);
  this->gndVehicleOK = 0;
  local_90 = &this->gndVehicleEntry;
  DataRefs::GetDebugAcFilter_abi_cxx11_(&this->txtDebugFilter,&dataRefs);
  local_98 = &this->txtDebugFilter;
  std::__cxx11::string::string((string *)&this->txtFixAcType,(string *)&dataRefs.cslFixAcIcaoType);
  local_a8 = &this->txtFixOp;
  local_a0 = &this->txtFixAcType;
  std::__cxx11::string::string((string *)local_a8,(string *)&dataRefs.cslFixOpIcao);
  local_b0 = &this->txtFixLivery;
  std::__cxx11::string::string((string *)local_b0,(string *)&dataRefs.cslFixLivery);
  local_b8 = &this->txtAptDump;
  (this->txtAptDump)._M_dataplus._M_p = (pointer)&(this->txtAptDump).field_2;
  (this->txtAptDump)._M_string_length = 0;
  (this->txtAptDump).field_2._M_local_buf[0] = '\0';
  vs = &dataRefs.aFlarmToIcaoAcTy;
  for (lVar1 = 0x200; lVar1 != 0x3c0; lVar1 = lVar1 + 0x20) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50," ",&local_f9);
    str_concat(&local_70,vs->_M_elems,&local_50);
    std::__cxx11::string::operator=
              ((string *)
               ((long)(local_f8->super_LTImgWindow).super_ImgWindow.mModelView + lVar1 + -0x20),
               (string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    vs = (array<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_14UL>
          *)(vs->_M_elems + 1);
  }
  DataRefs::GetOpenSkyCredentials(&dataRefs,local_c0,local_c8);
  std::__cxx11::string::_M_assign(local_d0);
  __val = DataRefs::GetCfgInt(DR_CFG_RT_TRAFFIC_PORT);
  std::__cxx11::to_string(&local_70,__val);
  std::__cxx11::string::operator=(local_d8,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  DataRefs::GetFSCharterCredentials(&dataRefs,local_e0,local_e8);
  std::__cxx11::string::_M_assign(local_f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"LiveTraffic Settings",(allocator<char> *)&local_50);
  this_00 = local_f8;
  ImgWindow::SetWindowTitle((ImgWindow *)local_f8,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  ImgWindow::SetWindowResizingLimits((ImgWindow *)this_00,300,300,99999,99999);
  (*(local_f8->super_LTImgWindow).super_ImgWindow._vptr_ImgWindow[2])(local_f8,1);
  (local_f8->super_LTImgWindow).szHelpURL = "setup/configuration#settings-ui";
  return;
}

Assistant:

LTSettingsUI::LTSettingsUI () :
LTImgWindow(WND_MODE_FLOAT_CNT_VR,
            dataRefs.SUItransp ? WND_STYLE_HUD : WND_STYLE_SOLID,
            dataRefs.SUIrect),
// If there is no ADSBEx key yet then display any new entry in clear text,
// If a key is already defined, then by default obscure it
sADSBExKeyEntry     (dataRefs.GetADSBExAPIKey()),
bADSBExKeyClearText (sADSBExKeyEntry.empty()),
// Fill CSL type entry with current values
acTypeEntry     (dataRefs.GetDefaultAcIcaoType()),
gndVehicleEntry (dataRefs.GetDefaultCarIcaoType()),
// Fill debug entry texts with current values
txtDebugFilter  (dataRefs.GetDebugAcFilter()),
txtFixAcType    (dataRefs.cslFixAcIcaoType),
txtFixOp        (dataRefs.cslFixOpIcao),
txtFixLivery    (dataRefs.cslFixLivery)
{
    /// GNF_COUNT is not available in SettingsUI.h (due to order of include files), make _now_ sure that aFlarmAcTys has the correct size
    assert (aFlarmAcTys.size() == size_t(FAT_UAV)+1);
    
    // Fill Flarm aircraft types with current values
    for (size_t i = 0; i < aFlarmAcTys.size(); i++)
        aFlarmAcTys[i] = str_concat(dataRefs.aFlarmToIcaoAcTy[i], " ");
    
    // Fetch OpenSky credentials
    dataRefs.GetOpenSkyCredentials(sOpenSkyUser, sOpenSkyPwd);
    
    // Fetch RealTraffic license and port number
    sRTLicenseEntry = dataRefs.GetRTLicense();
    sRTPort = std::to_string(DataRefs::GetCfgInt(DR_CFG_RT_TRAFFIC_PORT));
    
    // Fetch FSC credentials
    dataRefs.GetFSCharterCredentials(sFSCUser, sFSCPwd);
    
    // Fetch SayIntentions configuration
    sSIDisplayName = dataRefs.GetSIDisplayName();

    // Set up window basics
    SetWindowTitle(SUI_WND_TITLE);
    SetWindowResizingLimits(SUI_RESIZE_LIMITS.tl.x, SUI_RESIZE_LIMITS.tl.y,
                            SUI_RESIZE_LIMITS.br.x, SUI_RESIZE_LIMITS.br.y);
    SetVisible(true);
    
    // Define Help URL to open for generic Help (?) button
    szHelpURL = HELP_SETTINGS;
}